

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path_test.cpp
# Opt level: O0

void __thiscall
portability_path_test_portability_path_test_path_get_name_double_extension_Test::
~portability_path_test_portability_path_test_path_get_name_double_extension_Test
          (portability_path_test_portability_path_test_path_get_name_double_extension_Test *this)

{
  void *in_RDI;
  
  ~portability_path_test_portability_path_test_path_get_name_double_extension_Test
            ((portability_path_test_portability_path_test_path_get_name_double_extension_Test *)
             0x121c18);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST_F(portability_path_test, portability_path_test_path_get_name_double_extension)
{
	static const char base[] = "/a/b/c/.asd.yes";
	static const char result[] = ".asd";

	string_name name;

	size_t size = portability_path_get_name(base, sizeof(base), name, NAME_SIZE);

	EXPECT_EQ((int)0, (int)strcmp(name, result));
	EXPECT_EQ((size_t)size, (size_t)sizeof(result));
	EXPECT_EQ((char)'\0', (char)result[size - 1]);
}